

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::JsonUnitTestResultPrinter::OnTestIterationEnd
          (JsonUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  FILE *__stream;
  ostream *poVar2;
  GTestLog local_210 [2];
  stringstream stream;
  ostream local_200 [112];
  ios_base local_190 [264];
  string local_88;
  undefined1 local_68 [8];
  FilePath output_file;
  FilePath output_dir;
  
  FilePath::FilePath((FilePath *)local_68,&this->output_file_);
  FilePath::RemoveFileName
            ((FilePath *)((long)&output_file.pathname_.field_2 + 8),(FilePath *)local_68);
  bVar1 = FilePath::CreateDirectoriesRecursively
                    ((FilePath *)((long)&output_file.pathname_.field_2 + 8));
  if (bVar1) {
    __stream = fopen((this->output_file_)._M_dataplus._M_p,"w");
  }
  else {
    __stream = (FILE *)0x0;
  }
  if (__stream == (FILE *)0x0) {
    GTestLog::GTestLog(local_210,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/gtest/googletest/src/gtest.cc"
                       ,0xf4e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file \"",0x15);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->output_file_)._M_dataplus._M_p,
                        (this->output_file_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    GTestLog::~GTestLog(local_210);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_210);
  PrintJsonUnitTest(local_200,unit_test);
  StringStreamToString(&local_88,(stringstream *)local_210);
  fputs(local_88._M_dataplus._M_p,__stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_210);
  std::ios_base::~ios_base(local_190);
  if ((size_type *)output_file.pathname_.field_2._8_8_ != &output_dir.pathname_._M_string_length) {
    operator_delete((void *)output_file.pathname_.field_2._8_8_,
                    output_dir.pathname_._M_string_length + 1);
  }
  if (local_68 != (undefined1  [8])&output_file.pathname_._M_string_length) {
    operator_delete((void *)local_68,output_file.pathname_._M_string_length + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* jsonout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    jsonout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (jsonout == NULL) {
    // TODO(phosek): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.
    GTEST_LOG_(FATAL) << "Unable to open file \""
                      << output_file_ << "\"";
  }
  std::stringstream stream;
  PrintJsonUnitTest(&stream, unit_test);
  fprintf(jsonout, "%s", StringStreamToString(&stream).c_str());
  fclose(jsonout);
}